

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall amrex::AmrLevel::AmrLevel(AmrLevel *this)

{
  long lVar1;
  
  this->_vptr_AmrLevel = (_func_int **)&PTR__AmrLevel_00839b70;
  Geometry::Geometry(&this->geom);
  BoxArray::BoxArray(&this->grids);
  DistributionMapping::DistributionMapping(&this->dmap);
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fine_ratio).vect[1] = 0;
  (this->fine_ratio).vect[2] = 0;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->crse_ratio).vect[0] = 0;
  (this->crse_ratio).vect[1] = 0;
  *(undefined8 *)((this->crse_ratio).vect + 2) = 0;
  BoxArray::BoxArray(&this->m_AreaNotToTag);
  (this->m_AreaToTag).smallend.vect[0] = 1;
  (this->m_AreaToTag).smallend.vect[1] = 1;
  (this->m_AreaToTag).smallend.vect[2] = 1;
  (this->m_AreaToTag).bigend.vect[0] = 0;
  (this->m_AreaToTag).bigend.vect[1] = 0;
  *(undefined8 *)((this->m_AreaToTag).bigend.vect + 2) = 0;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::FArrayBox> *)0x0;
  lVar1 = 0;
  do {
    BoxArray::BoxArray((BoxArray *)((long)(&this->m_AreaToTag + 1) + lVar1 + 0x14));
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0x138);
  BoxArray::BoxArray(&this->nodal_grids);
  this->parent = (Amr *)0x0;
  this->level = -1;
  this->levelDirectoryCreated = false;
  return;
}

Assistant:

AmrLevel::AmrLevel () noexcept
{

   BL_PROFILE("AmrLevel::AmrLevel()");
   parent = 0;
   level = -1;
   levelDirectoryCreated = false;
}